

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_info.cpp
# Opt level: O3

int module_load(Server *server)

{
  char cVar1;
  ifstream file;
  value_type local_218 [65];
  
  puts("Loading module info...");
  std::ifstream::ifstream(local_218);
  std::ifstream::open((char *)local_218,0x14402a);
  cVar1 = std::ios::widen((char)local_218 + (char)*(undefined8 *)(local_218[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_218,(string *)&version_abi_cxx11_,cVar1);
  std::ifstream::~ifstream(local_218);
  refresh_mem_info();
  refresh_disk_info();
  refresh_thread_info();
  Server::append_to_hook<void(*)(Server*)>
            ((vector<void_(*)(Server_*),_std::allocator<void_(*)(Server_*)>_> *)(server + 0x18),
             timer_handler);
  local_218[0] = http_request_handler;
  std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>::insert
            ((vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_> *)
             server,(const_iterator)*(_func_HTTPResponse_ptr_Client_ptr ***)server,local_218);
  puts("Loaded module info");
  return 0;
}

Assistant:

int module_load(Server *server) {
    printf("Loading module info...\n");
    get_version_info();
    refresh_mem_info();
    refresh_disk_info();
    refresh_thread_info();
    Server::append_to_hook(server->timer_hook, &timer_handler);
    Server::insert_to_front_of_hook(server->http_request_hook, &http_request_handler);
    printf("Loaded module info\n");
    return 0;
}